

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O3

JavascriptString * __thiscall
Js::DynamicObjectPropertyEnumerator::MoveAndGetNextWithCache
          (DynamicObjectPropertyEnumerator *this,PropertyId *propertyId,
          PropertyAttributes *attributes)

{
  WriteBarrierPtr<Js::PropertyString> *addr;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  JavascriptString *pJVar5;
  PropertyString *obj;
  PropertyString *pPVar6;
  CachedData *pCVar7;
  int iVar8;
  long lVar9;
  int local_3c;
  PropertyId local_38;
  PropertyId tempPropertyId;
  PropertyId tempPropertyId_1;
  PropertyAttributes propertyAttributes;
  
  if (((this->scriptContext).ptr)->threadContext->TTDLog != (EventLog *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                ,0xaa,
                                "(!this->scriptContext->GetThreadContext()->IsRuntimeInTTDMode())",
                                "We should always trap out to explicit enumeration in this case");
    if (!bVar2) goto LAB_00db0d42;
    *puVar4 = 0;
  }
  iVar3 = this->enumeratedCount;
  pCVar7 = (this->cachedData).ptr;
  iVar8 = pCVar7->cachedCount;
  if (iVar8 < iVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                ,0xad,"(enumeratedCount <= cachedData->cachedCount)",
                                "enumeratedCount <= cachedData->cachedCount");
    if (!bVar2) goto LAB_00db0d42;
    *puVar4 = 0;
    iVar3 = this->enumeratedCount;
    pCVar7 = (this->cachedData).ptr;
    iVar8 = pCVar7->cachedCount;
  }
  tempPropertyId._3_1_ = '\0';
  if (iVar3 < iVar8) {
    obj = (pCVar7->strings).ptr[iVar3].ptr;
    *propertyId = ((obj->propertyRecordUsageCache).propertyRecord.ptr)->pid;
    MoveAndGetNextNoCache(this,&local_3c,attributes);
    if (local_3c != *propertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0xba,"(tempPropertyId == propertyId)",
                                  "tempPropertyId == propertyId");
      if (!bVar2) goto LAB_00db0d42;
      *puVar4 = 0;
    }
    iVar3 = this->objectIndex;
    iVar8 = this->enumeratedCount;
    pCVar7 = (this->cachedData).ptr;
    lVar9 = (long)iVar8;
    if (iVar3 != (pCVar7->indexes).ptr[lVar9]) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0xbb,
                                  "(this->objectIndex == cachedData->indexes[enumeratedCount])",
                                  "this->objectIndex == cachedData->indexes[enumeratedCount]");
      if (!bVar2) {
LAB_00db0d42:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      pCVar7 = (this->cachedData).ptr;
      iVar8 = this->enumeratedCount;
      lVar9 = (long)iVar8;
      iVar3 = (pCVar7->indexes).ptr[lVar9];
    }
    this->objectIndex = iVar3;
    tempPropertyId._3_1_ = (pCVar7->attributes).ptr[lVar9];
    this->enumeratedCount = iVar8 + 1;
  }
  else {
    if (pCVar7->completed == false) {
      obj = (PropertyString *)
            MoveAndGetNextNoCache(this,propertyId,(PropertyAttributes *)((long)&tempPropertyId + 3))
      ;
      if (obj != (PropertyString *)0x0) {
        bVar2 = VarIsImpl<Js::PropertyString>((RecyclableObject *)obj);
        if (bVar2) {
          pPVar6 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>((JavascriptString *)obj);
          if (pPVar6 != (PropertyString *)0x0) {
            iVar3 = this->enumeratedCount;
            if (this->initialPropertyCount <= iVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar4 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                          ,0xcc,"(enumeratedCount < this->initialPropertyCount)",
                                          "enumeratedCount < this->initialPropertyCount");
              if (!bVar2) goto LAB_00db0d42;
              *puVar4 = 0;
              iVar3 = this->enumeratedCount;
            }
            addr = (((this->cachedData).ptr)->strings).ptr + iVar3;
            Memory::Recycler::WBSetBit((char *)addr);
            addr->ptr = pPVar6;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
            pCVar7 = (this->cachedData).ptr;
            (pCVar7->indexes).ptr[this->enumeratedCount] = this->objectIndex;
            (pCVar7->attributes).ptr[this->enumeratedCount] = tempPropertyId._3_1_;
            iVar3 = this->enumeratedCount + 1;
            this->enumeratedCount = iVar3;
            ((this->cachedData).ptr)->cachedCount = iVar3;
          }
        }
        goto LAB_00db0d26;
      }
      ((this->cachedData).ptr)->completed = true;
    }
    else {
      pJVar5 = MoveAndGetNextNoCache(this,&local_38,attributes);
      if (pJVar5 != (JavascriptString *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                    ,0xdc,
                                    "(this->MoveAndGetNextNoCache(tempPropertyId, attributes) == nullptr)"
                                    ,
                                    "this->MoveAndGetNextNoCache(tempPropertyId, attributes) == nullptr"
                                   );
        if (!bVar2) goto LAB_00db0d42;
        *puVar4 = 0;
      }
    }
    obj = (PropertyString *)0x0;
  }
LAB_00db0d26:
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = tempPropertyId._3_1_;
  }
  return &obj->super_JavascriptString;
}

Assistant:

JavascriptString * DynamicObjectPropertyEnumerator::MoveAndGetNextWithCache(PropertyId& propertyId, PropertyAttributes* attributes)
    {
#if ENABLE_TTD
        AssertMsg(!this->scriptContext->GetThreadContext()->IsRuntimeInTTDMode(), "We should always trap out to explicit enumeration in this case");
#endif

        Assert(enumeratedCount <= cachedData->cachedCount);
        JavascriptString* propertyStringName;
        PropertyAttributes propertyAttributes = PropertyNone;
        if (enumeratedCount < cachedData->cachedCount)
        {
            PropertyString * propertyString = cachedData->strings[enumeratedCount];
            propertyStringName = propertyString;
            propertyId = propertyString->GetPropertyId();

#if DBG
            PropertyId tempPropertyId;
            /* JavascriptString * tempPropertyString = */ this->MoveAndGetNextNoCache(tempPropertyId, attributes);

            Assert(tempPropertyId == propertyId);
            Assert(this->objectIndex == cachedData->indexes[enumeratedCount]);
#endif

            this->objectIndex = cachedData->indexes[enumeratedCount];
            propertyAttributes = cachedData->attributes[enumeratedCount];

            enumeratedCount++;
        }
        else if (!cachedData->completed)
        {
            propertyStringName = this->MoveAndGetNextNoCache(propertyId, &propertyAttributes);

            if (propertyStringName)
            {
                PropertyString* propertyString = JavascriptOperators::TryFromVar<PropertyString>(propertyStringName);
                if (propertyString != nullptr)
                {
                    Assert(enumeratedCount < this->initialPropertyCount);
                    cachedData->strings[enumeratedCount] = propertyString;
                    cachedData->indexes[enumeratedCount] = this->objectIndex;
                    cachedData->attributes[enumeratedCount] = propertyAttributes;
                    cachedData->cachedCount = ++enumeratedCount;
                }
            }
            else
            {
                cachedData->completed = true;
            }
        }
        else
        {
#if DBG
            PropertyId tempPropertyId;
            Assert(this->MoveAndGetNextNoCache(tempPropertyId, attributes) == nullptr);
#endif

            propertyStringName = nullptr;
        }

        if (attributes != nullptr)
        {
            *attributes = propertyAttributes;
        }

        return propertyStringName;
    }